

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O3

void fai_insert_index(faidx_t *idx,char *name,int len,int line_len,int line_blen,uint64_t offset)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  kh_s_t *h;
  khint32_t *pkVar5;
  faidx1_t *pfVar6;
  ulong uVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  char **ppcVar12;
  char *pcVar13;
  sbyte sVar14;
  byte bVar15;
  char *pcVar16;
  uint uVar17;
  uint uVar18;
  khint_t new_n_buckets;
  ulong uVar19;
  uint uVar20;
  bool bVar21;
  
  iVar9 = idx->n;
  if (iVar9 == idx->m) {
    iVar11 = 0x10;
    if (iVar9 != 0) {
      iVar11 = iVar9 * 2;
    }
    idx->m = iVar11;
    ppcVar12 = (char **)realloc(idx->name,(long)iVar11 << 3);
    idx->name = ppcVar12;
    iVar9 = idx->n;
  }
  else {
    ppcVar12 = idx->name;
  }
  pcVar13 = strdup(name);
  ppcVar12[iVar9] = pcVar13;
  h = idx->hash;
  pcVar13 = idx->name[iVar9];
  if (h->upper_bound <= h->n_occupied) {
    uVar3 = h->n_buckets;
    if (h->size * 2 < uVar3) {
      new_n_buckets = uVar3 - 1;
    }
    else {
      new_n_buckets = uVar3 + 1;
    }
    iVar9 = kh_resize_s(h,new_n_buckets);
    if (iVar9 < 0) {
      uVar19 = (ulong)h->n_buckets;
      goto LAB_00135bab;
    }
  }
  uVar3 = h->n_buckets;
  uVar19 = (ulong)uVar3;
  uVar20 = (uint)*pcVar13;
  if (*pcVar13 == '\0') {
    uVar20 = 0;
  }
  else {
    cVar8 = pcVar13[1];
    if (cVar8 != '\0') {
      pcVar16 = pcVar13 + 2;
      do {
        uVar20 = (int)cVar8 + uVar20 * 0x1f;
        cVar8 = *pcVar16;
        pcVar16 = pcVar16 + 1;
      } while (cVar8 != '\0');
    }
  }
  uVar20 = uVar20 & uVar3 - 1;
  pkVar5 = h->flags;
  if ((pkVar5[uVar20 >> 4] >> ((char)uVar20 * '\x02' & 0x1fU) & 2) == 0) {
    iVar9 = 1;
    uVar17 = uVar20;
    do {
      uVar4 = pkVar5[uVar17 >> 4];
      uVar18 = uVar17 * 2 & 0x1e;
      sVar14 = (sbyte)uVar18;
      uVar10 = uVar4 >> sVar14;
      if (((uVar10 & 2) != 0) ||
         (((uVar10 & 1) == 0 && (iVar11 = strcmp(h->keys[uVar17],pcVar13), iVar11 == 0)))) {
        bVar21 = (uVar4 >> sVar14 & 2) == 0;
        uVar20 = (uint)uVar19;
        goto LAB_00135b28;
      }
      if ((uVar4 >> uVar18 & 1) != 0) {
        uVar19 = (ulong)uVar17;
      }
      uVar17 = uVar17 + iVar9 & uVar3 - 1;
      iVar9 = iVar9 + 1;
    } while (uVar17 != uVar20);
    bVar21 = true;
    uVar17 = uVar20;
    uVar20 = uVar3;
    if ((uint)uVar19 == uVar3) {
LAB_00135b28:
      if (uVar20 == uVar3) {
        uVar20 = uVar17;
      }
      if (bVar21) {
        uVar20 = uVar17;
      }
      uVar19 = (ulong)uVar20;
    }
  }
  else {
    uVar19 = (ulong)uVar20;
  }
  uVar7 = uVar19 >> 4;
  bVar15 = (char)uVar19 * '\x02' & 0x1e;
  if ((pkVar5[uVar7] >> bVar15 & 2) == 0) {
    if ((pkVar5[uVar7] >> bVar15 & 1) != 0) {
      h->keys[uVar19] = pcVar13;
      h->flags[uVar7] = h->flags[uVar7] & ~(3 << bVar15);
      h->size = h->size + 1;
    }
  }
  else {
    h->keys[uVar19] = pcVar13;
    h->flags[uVar7] = h->flags[uVar7] & ~(3 << bVar15);
    uVar1 = h->size;
    uVar2 = h->n_occupied;
    h->size = uVar1 + 1;
    h->n_occupied = uVar2 + 1;
  }
LAB_00135bab:
  pfVar6 = idx->hash->vals;
  pfVar6[uVar19].line_len = line_len;
  pfVar6[uVar19].line_blen = line_blen;
  pfVar6[uVar19].len = (long)len;
  pfVar6[uVar19].offset = offset;
  idx->n = idx->n + 1;
  return;
}

Assistant:

static inline void fai_insert_index(faidx_t *idx, const char *name, int len, int line_len, int line_blen, uint64_t offset)
{
    khint_t k;
    int ret;
    faidx1_t t;
    if (idx->n == idx->m) {
        idx->m = idx->m? idx->m<<1 : 16;
        idx->name = (char**)realloc(idx->name, sizeof(char*) * idx->m);
    }
    idx->name[idx->n] = strdup(name);
    k = kh_put(s, idx->hash, idx->name[idx->n], &ret);
    t.len = len; t.line_len = line_len; t.line_blen = line_blen; t.offset = offset;
    kh_value(idx->hash, k) = t;
    ++idx->n;
}